

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void google::protobuf::anon_unknown_1::DeleteGeneratedPool(void)

{
  DescriptorPool *pDVar1;
  
  if ((anonymous_namespace)::generated_database_ != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::generated_database_ + 8))();
  }
  pDVar1 = (anonymous_namespace)::generated_pool_;
  (anonymous_namespace)::generated_database_ = (long *)0x0;
  if ((anonymous_namespace)::generated_pool_ != (DescriptorPool *)0x0) {
    DescriptorPool::~DescriptorPool((anonymous_namespace)::generated_pool_);
  }
  operator_delete(pDVar1,0x68);
  (anonymous_namespace)::generated_pool_ = (DescriptorPool *)0x0;
  return;
}

Assistant:

void DeleteGeneratedPool() {
  delete generated_database_;
  generated_database_ = NULL;
  delete generated_pool_;
  generated_pool_ = NULL;
}